

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexFilters.cpp
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexWidth4Filter::buildKernelAxis
          (PtexWidth4Filter *this,int8_t *k_ureslog2,int *k_u,int *k_uw,float *ku,float u,float uw,
          int f_ureslog2)

{
  int iVar1;
  uint uVar2;
  int *in_RCX;
  uint *in_RDX;
  byte *in_RSI;
  PtexWidth4Filter *in_RDI;
  float *in_R8;
  int in_R9D;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  float in_XMM1_Da;
  int i_3;
  float step_1;
  float x1_3;
  float kc_2;
  float kb_2;
  float ka_2;
  float xc_2;
  float xb_2;
  float xa_2;
  int i_2;
  float x1_2;
  float step;
  int u2;
  int u1;
  float dupix;
  float uwpix;
  float upix;
  float ui;
  float upix_3;
  float kc_1;
  float kb_1;
  float ka_1;
  float s_1;
  float xc_1;
  float xb_1;
  float xa_1;
  int i_1;
  float x1_1;
  float upix_2;
  float kc;
  float kb;
  float ka;
  float s;
  float xc;
  float xb;
  float xa;
  int i;
  float x1;
  int u2_1;
  int u1_1;
  float upix_1;
  float lerp1;
  float lerp2;
  float uwlo;
  int resu;
  float local_f8;
  int local_e8;
  int local_c4;
  int local_80;
  int local_58;
  
  fVar3 = PtexUtils::reciprocalPow2(in_R9D);
  fVar3 = PtexUtils::max<float>(in_XMM1_Da,fVar3);
  iVar1 = PtexUtils::calcResFromWidth(fVar3);
  *in_RSI = (byte)iVar1;
  iVar1 = 1 << (*in_RSI & 0x1f);
  if (((in_RDI->super_PtexSeparableFilter)._options.lerp & 1U) == 0) {
    local_f8 = 0.0;
  }
  else {
    local_f8 = (fVar3 - 1.0 / (float)iVar1) / (1.0 / (float)iVar1);
  }
  fVar4 = 1.0 - local_f8;
  if (fVar3 < 0.25) {
    fVar5 = in_XMM0_Da * (float)iVar1 + -0.5;
    fVar3 = fVar3 * (float)iVar1;
    dVar9 = std::ceil((double)(ulong)(uint)(fVar5 - fVar3 * 2.0));
    uVar2 = (uint)SUB84(dVar9,0);
    dVar9 = std::ceil((double)(ulong)(uint)(fVar5 + fVar3 * 2.0));
    if ((local_f8 != 0.0) || (NAN(local_f8))) {
      uVar2 = uVar2 & 0xfffffffe;
      *in_RDX = uVar2;
      *in_RCX = ((int)SUB84(dVar9,0) + 1U & 0xfffffffe) - uVar2;
      fVar3 = 1.0 / fVar3;
      for (local_c4 = 0; local_c4 < *in_RCX; local_c4 = local_c4 + 2) {
        fVar6 = (float)local_c4 * fVar3 + ((float)(int)uVar2 - fVar5) * fVar3;
        fVar7 = (*in_RDI->_k)(fVar6,in_RDI->_c);
        fVar8 = (*in_RDI->_k)(fVar6 + fVar3,in_RDI->_c);
        fVar6 = (*in_RDI->_k)((fVar6 + fVar6 + fVar3) * 0.5,in_RDI->_c);
        in_R8[local_c4] = fVar7 * fVar4 + fVar6 * local_f8;
        in_R8[local_c4 + 1] = fVar8 * fVar4 + fVar6 * local_f8;
      }
    }
    else {
      *in_RDX = uVar2;
      *in_RCX = (int)SUB84(dVar9,0) - uVar2;
      for (local_e8 = 0; local_e8 < *in_RCX; local_e8 = local_e8 + 1) {
        fVar4 = (*in_RDI->_k)((float)local_e8 * (1.0 / fVar3) + ((float)(int)uVar2 - fVar5) / fVar3,
                              in_RDI->_c);
        in_R8[local_e8] = fVar4;
      }
    }
  }
  else if (0.5 <= fVar3) {
    if (1.0 <= fVar3) {
      *in_RSI = 0;
      *in_RCX = 2;
      dVar9 = std::floor((double)(ulong)(uint)(in_XMM0_Da - 0.5));
      *in_RDX = (int)SUB84(dVar9,0);
      fVar3 = blur(in_RDI,in_XMM1_Da);
      *in_R8 = fVar3;
      in_R8[1] = 1.0 - *in_R8;
    }
    else {
      *in_RSI = 1;
      dVar9 = std::floor((double)(ulong)(uint)(in_XMM0_Da - 0.5));
      *in_RDX = (int)SUB84(dVar9,0) << 1;
      *in_RCX = 4;
      for (local_80 = 0; local_80 < *in_RCX; local_80 = local_80 + 2) {
        fVar3 = blur(in_RDI,in_XMM1_Da);
        fVar5 = blur(in_RDI,in_XMM1_Da);
        fVar6 = blur(in_RDI,in_XMM1_Da);
        in_R8[local_80] = fVar3 * fVar4 + fVar6 * local_f8;
        in_R8[local_80 + 1] = fVar5 * fVar4 + fVar6 * local_f8;
      }
    }
  }
  else {
    *in_RSI = 2;
    fVar3 = in_XMM0_Da * 4.0 + -0.5;
    dVar9 = std::ceil((double)(ulong)(uint)(fVar3 - 2.0));
    dVar10 = std::ceil((double)(ulong)(uint)(fVar3 + 2.0));
    uVar2 = (int)SUB84(dVar9,0) & 0xfffffffe;
    *in_RDX = uVar2;
    *in_RCX = ((int)SUB84(dVar10,0) + 1U & 0xfffffffe) - uVar2;
    for (local_58 = 0; local_58 < *in_RCX; local_58 = local_58 + 2) {
      fVar5 = ((float)(int)uVar2 - fVar3) + (float)local_58;
      fVar6 = (*in_RDI->_k)(fVar5,in_RDI->_c);
      fVar5 = (*in_RDI->_k)(fVar5 + 1.0,in_RDI->_c);
      fVar7 = blur(in_RDI,in_XMM1_Da);
      in_R8[local_58] = fVar6 * fVar4 + fVar7 * local_f8;
      in_R8[local_58 + 1] = fVar5 * fVar4 + fVar7 * local_f8;
    }
  }
  return;
}

Assistant:

void buildKernelAxis(int8_t& k_ureslog2, int& k_u, int& k_uw, float* ku,
                         float u, float uw, int f_ureslog2)
    {
        // build 1 axis (note: "u" labels may repesent either u or v axis)

        // clamp filter width to no smaller than a texel
        uw = PtexUtils::max(uw, PtexUtils::reciprocalPow2(f_ureslog2));

        // compute desired texture res based on filter width
        k_ureslog2 = (int8_t)PtexUtils::calcResFromWidth(uw);
        int resu = 1 << k_ureslog2;
        float uwlo = 1.0f/(float)resu; // smallest filter width for this res

        // compute lerp weights (amount to blend towards next-lower res)
        float lerp2 = _options.lerp ? (uw-uwlo)/uwlo : 0;
        float lerp1 = 1.0f-lerp2;

        // adjust for large filter widths
        if (uw >= .25f) {
            if (uw < .5f) {
                k_ureslog2 = 2;
                float upix = u * 4.0f - 0.5f;
                int u1 = int(PtexUtils::ceil(upix - 2)), u2 = int(PtexUtils::ceil(upix + 2));
                u1 = u1 & ~1;       // round down to even pair
                u2 = (u2 + 1) & ~1; // round up to even pair
                k_u = u1;
                k_uw = u2-u1;
                float x1 = (float)u1-upix;
                for (int i = 0; i < k_uw; i+=2) {
                    float xa = x1 + (float)i, xb = xa + 1.0f, xc = (xa+xb)*0.25f;
                    // spread the filter gradually to approach the next-lower-res width
                    // at uw = .5, s = 1.0; at uw = 1, s = 0.8
                    float s = 1.0f/(uw + .75f);
                    float ka = _k(xa, _c), kb = _k(xb, _c), kc = blur(xc*s);
                    ku[i] = ka * lerp1 + kc * lerp2;
                    ku[i+1] = kb * lerp1 + kc * lerp2;
                }
                return;
            }
            else if (uw < 1) {
                k_ureslog2 = 1;
                float upix = u * 2.0f - 0.5f;
                k_u = int(PtexUtils::floor(u - .5f))*2;
                k_uw = 4;
                float x1 = (float)k_u-upix;
                for (int i = 0; i < k_uw; i+=2) {
                    float xa = x1 + (float)i, xb = xa + 1.0f, xc = (xa+xb)*0.5f;
                    // spread the filter gradually to approach the next-lower-res width
                    // at uw = .5, s = .8; at uw = 1, s = 0.5
                    float s = 1.0f/(uw*1.5f + .5f);
                    float ka = blur(xa*s), kb = blur(xb*s), kc = blur(xc*s);
                    ku[i] = ka * lerp1 + kc * lerp2;
                    ku[i+1] = kb * lerp1 + kc * lerp2;
                }
                return;
            }
            else {
                // use res 0 (1 texel per face) w/ no lerping
                // (future: use face-blended values for filter > 2)
                k_ureslog2 = 0;
                float upix = u - .5f;
                k_uw = 2;
                float ui = PtexUtils::floor(upix);
                k_u = int(ui);
                ku[0] = blur(upix-ui);
                ku[1] = 1-ku[0];
                return;
            }
        }

        // convert from normalized coords to pixel coords
        float upix = u * (float)resu - 0.5f;
        float uwpix = uw * (float)resu;

        // find integer pixel extent: [u,v] +/- [2*uw,2*vw]
        // (kernel width is 4 times filter width)
        float dupix = 2.0f*uwpix;
        int u1 = int(PtexUtils::ceil(upix - dupix)), u2 = int(PtexUtils::ceil(upix + dupix));

        if (lerp2) {
            // lerp kernel weights towards next-lower res
            // extend kernel width to cover even pairs
            u1 = u1 & ~1;
            u2 = (u2 + 1) & ~1;
            k_u = u1;
            k_uw = u2-u1;

            // compute kernel weights
            float step = 1.0f/uwpix, x1 = ((float)u1-upix)*(float)step;
            for (int i = 0; i < k_uw; i+=2) {
                float xa = x1 + (float)i*step, xb = xa + step, xc = (xa+xb)*0.5f;
                float ka = _k(xa, _c), kb = _k(xb, _c), kc = _k(xc, _c);
                ku[i] = ka * lerp1 + kc * lerp2;
                ku[i+1] = kb * lerp1 + kc * lerp2;
            }
        }
        else {
            k_u = u1;
            k_uw = u2-u1;
            // compute kernel weights
            float x1 = ((float)u1-upix)/uwpix, step = 1.0f/uwpix;
            for (int i = 0; i < k_uw; i++) ku[i] = _k(x1 + (float)i*step, _c);
        }
    }